

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov2.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  float *pfVar1;
  char *pcVar2;
  float fVar3;
  pointer pOVar4;
  char cVar5;
  float fVar6;
  ulong uVar7;
  long lVar8;
  int i;
  int iVar9;
  float fVar10;
  __m128 t_2;
  __m128 t;
  allocator local_2f9;
  undefined1 local_2f8 [12];
  float fStack_2ec;
  undefined8 local_2e8;
  int baseLine;
  ulong local_2d0;
  float mean_vals [3];
  Size label_size;
  vector<Object,_std::allocator<Object>_> objects;
  float norm_vals [3];
  float local_280;
  int local_27c;
  Mat in;
  Mat out;
  Extractor ex;
  Mat m;
  int local_190;
  int local_18c;
  uchar *local_188;
  Net yolov2;
  
  if (argc == 2) {
    pcVar2 = argv[1];
    std::__cxx11::string::string((string *)&yolov2,pcVar2,(allocator *)&ex);
    cv::imread((string *)&m,(int)&yolov2);
    std::__cxx11::string::~string((string *)&yolov2);
    cVar5 = cv::Mat::empty();
    if (cVar5 == '\0') {
      objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      ncnn::Net::Net(&yolov2);
      ncnn::Net::load_param(&yolov2,"mobilenet_yolo.param");
      ncnn::Net::load_model(&yolov2,"mobilenet_yolo.bin");
      ncnn::Mat::from_pixels_resize
                (&in,local_188,2,local_18c,local_190,0x1a0,0x1a0,(Allocator *)0x0);
      mean_vals[0] = 1.0;
      mean_vals[1] = 1.0;
      mean_vals[2] = 1.0;
      norm_vals[0] = 0.007843;
      norm_vals[1] = 0.007843;
      norm_vals[2] = 0.007843;
      ncnn::Mat::substract_mean_normalize(&in,(float *)0x0,norm_vals);
      ncnn::Mat::substract_mean_normalize(&in,mean_vals,(float *)0x0);
      ncnn::Net::create_extractor(&ex,&yolov2);
      ncnn::Extractor::set_num_threads(&ex,4);
      ncnn::Extractor::input(&ex,"data",&in);
      out.elemsize._0_4_ = 0;
      out.elemsize._4_4_ = 0;
      out.elempack = 0;
      out.data = (void *)0x0;
      out.refcount._0_4_ = 0;
      out.refcount._4_4_ = 0;
      out.allocator = (Allocator *)0x0;
      out.dims = 0;
      out.w = 0;
      out.h = 0;
      out.c = 0;
      out.cstep = 0;
      ncnn::Extractor::extract(&ex,"detection_out",&out);
      if (objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start) {
        objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
        _M_finish = objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                    super__Vector_impl_data._M_start;
      }
      local_2d0 = CONCAT44(local_2d0._4_4_,(float)local_18c);
      for (iVar9 = 0; iVar9 < out.h; iVar9 = iVar9 + 1) {
        lVar8 = (long)iVar9 * (long)out.w * CONCAT44(out.elemsize._4_4_,(undefined4)out.elemsize);
        local_2e8._4_4_ = *(float *)((long)out.data + lVar8 + 4);
        local_2e8._0_4_ = (int)*(float *)((long)out.data + lVar8);
        local_2f8._0_4_ = *(float *)((long)out.data + lVar8 + 8) * (float)local_2d0;
        local_2f8._4_4_ = *(float *)((long)out.data + lVar8 + 0xc) * (float)local_190;
        stack0xfffffffffffffd10 =
             (Extractor *)
             CONCAT44(*(float *)((long)out.data + lVar8 + 0x14) * (float)local_190 -
                      (float)local_2f8._4_4_,
                      *(float *)((long)out.data + lVar8 + 0x10) * (float)local_2d0 -
                      (float)local_2f8._0_4_);
        std::vector<Object,_std::allocator<Object>_>::push_back(&objects,(value_type *)local_2f8);
      }
      ncnn::Mat::~Mat(&out);
      ncnn::Extractor::~Extractor(&ex);
      ncnn::Mat::~Mat(&in);
      ncnn::Net::~Net(&yolov2);
      cv::Mat::clone();
      lVar8 = 0;
      uVar7 = 0;
      while( true ) {
        pOVar4 = objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((ulong)(((long)objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                          super__Vector_impl_data._M_start) / 0x18) <= uVar7) break;
        local_2d0 = uVar7;
        fprintf(_stderr,"%d = %.5f at %.2f %.2f %.2f x %.2f\n",
                SUB84((double)*(float *)((long)&(objects.
                                                 super__Vector_base<Object,_std::allocator<Object>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->prob +
                                        lVar8),0),
                (double)*(float *)((long)&((objects.
                                            super__Vector_base<Object,_std::allocator<Object>_>.
                                            _M_impl.super__Vector_impl_data._M_start)->rect).x +
                                  lVar8),
                (double)*(float *)((long)&((objects.
                                            super__Vector_base<Object,_std::allocator<Object>_>.
                                            _M_impl.super__Vector_impl_data._M_start)->rect).y +
                                  lVar8),
                (double)*(float *)((long)&((objects.
                                            super__Vector_base<Object,_std::allocator<Object>_>.
                                            _M_impl.super__Vector_impl_data._M_start)->rect).width +
                                  lVar8),
                (double)*(float *)((long)&((objects.
                                            super__Vector_base<Object,_std::allocator<Object>_>.
                                            _M_impl.super__Vector_impl_data._M_start)->rect).height
                                  + lVar8),
                (ulong)*(uint *)((long)&(objects.super__Vector_base<Object,_std::allocator<Object>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->label + lVar8))
        ;
        in.elemsize = 0;
        in.data = (void *)CONCAT44(in.data._4_4_,0x3010000);
        pfVar1 = (float *)((long)&(pOVar4->rect).x + lVar8);
        mean_vals[2] = (float)(int)ROUND(pfVar1[2]);
        mean_vals[1] = (float)(int)ROUND(pfVar1[1]);
        mean_vals[0] = (float)(int)ROUND(*pfVar1);
        in.refcount = (int *)&ex;
        cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&yolov2);
        yolov2.opt.lightmode = false;
        yolov2.opt._1_3_ = 0;
        yolov2.opt.num_threads = 0x406fe000;
        yolov2.opt.blob_allocator = (Allocator *)0x0;
        yolov2.opt.workspace_allocator = (Allocator *)0x0;
        yolov2.opt.use_winograd_convolution = false;
        yolov2.opt.use_sgemm_convolution = false;
        yolov2.opt.use_int8_inference = false;
        yolov2.opt.use_vulkan_compute = false;
        yolov2.opt.use_fp16_packed = false;
        yolov2.opt.use_fp16_storage = false;
        yolov2.opt.use_fp16_arithmetic = false;
        yolov2.opt.use_int8_storage = false;
        cv::rectangle(&in,mean_vals,&yolov2,1,8,0);
        sprintf((char *)&yolov2,"%s %.1f%%",
                SUB84((double)(*(float *)((long)&pOVar4->prob + lVar8) * 100.0),0),
                _ZZL12draw_objectsRKN2cv3MatERKSt6vectorI6ObjectSaIS4_EEE11class_names_rel +
                *(int *)(_ZZL12draw_objectsRKN2cv3MatERKSt6vectorI6ObjectSaIS4_EEE11class_names_rel
                        + (long)*(int *)((long)&pOVar4->label + lVar8) * 4));
        baseLine = 0;
        std::__cxx11::string::string((string *)&in,(char *)&yolov2,(allocator *)local_2f8);
        cv::getTextSize((string *)&label_size,(int)&in,0.5,0,(int *)0x1);
        std::__cxx11::string::~string((string *)&in);
        fVar6 = (float)(int)*(float *)((long)&(pOVar4->rect).x + lVar8);
        fVar10 = (float)(int)((*(float *)((long)&(pOVar4->rect).y + lVar8) -
                              (float)label_size.height) - (float)baseLine);
        if ((int)fVar10 < 1) {
          fVar10 = 0.0;
        }
        fVar3 = (float)(ex.blob_mats.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                        _M_impl.super__Vector_impl_data._M_start._4_4_ - label_size.width);
        if (label_size.width + (int)fVar6 <=
            ex.blob_mats.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
            super__Vector_impl_data._M_start._4_4_) {
          fVar3 = fVar6;
        }
        local_2e8._0_4_ = 0;
        local_2e8._4_4_ = 0.0;
        local_2f8._0_4_ = 3.7909693e-37;
        norm_vals[1] = fVar10;
        norm_vals[0] = fVar3;
        norm_vals[2] = (float)label_size.width;
        unique0x10000b5d = &ex;
        cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&in);
        in.data = (void *)0x406fe00000000000;
        in.refcount = (int *)0x406fe00000000000;
        in.elemsize = 0x406fe00000000000;
        in.elempack = 0;
        in._28_4_ = 0;
        cv::rectangle(local_2f8,norm_vals,&in,0xffffffffffffffff,8,0);
        local_2e8._0_4_ = 0;
        local_2e8._4_4_ = 0.0;
        local_2f8._0_4_ = 3.7909693e-37;
        unique0x10000b65 = &ex;
        std::__cxx11::string::string((string *)&in,(char *)&yolov2,&local_2f9);
        local_27c = (int)fVar10 + label_size.height;
        local_280 = fVar3;
        cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&out);
        out.elemsize._0_4_ = 0;
        out.elemsize._4_4_ = 0;
        out.elempack = 0;
        out._28_4_ = 0;
        out.data = (void *)0x0;
        out.refcount._0_4_ = 0;
        out.refcount._4_4_ = 0;
        cv::putText(0,local_2f8,&in,&local_280,0,&out,1,8,0);
        std::__cxx11::string::~string((string *)&in);
        uVar7 = local_2d0 + 1;
        lVar8 = lVar8 + 0x18;
      }
      std::__cxx11::string::string((string *)&yolov2,"image",(allocator *)local_2f8);
      in.elemsize = 0;
      in.data = (void *)CONCAT44(in.data._4_4_,0x1010000);
      in.refcount = (int *)&ex;
      cv::imshow((string *)&yolov2,(_InputArray *)&in);
      std::__cxx11::string::~string((string *)&yolov2);
      iVar9 = 0;
      cv::waitKey(0);
      cv::Mat::~Mat((Mat *)&ex);
      std::_Vector_base<Object,_std::allocator<Object>_>::~_Vector_base
                (&objects.super__Vector_base<Object,_std::allocator<Object>_>);
    }
    else {
      fprintf(_stderr,"cv::imread %s failed\n",pcVar2);
      iVar9 = -1;
    }
    cv::Mat::~Mat(&m);
  }
  else {
    fprintf(_stderr,"Usage: %s [imagepath]\n",*argv);
    iVar9 = -1;
  }
  return iVar9;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc != 2)
    {
        fprintf(stderr, "Usage: %s [imagepath]\n", argv[0]);
        return -1;
    }

    const char* imagepath = argv[1];

    cv::Mat m = cv::imread(imagepath, 1);
    if (m.empty())
    {
        fprintf(stderr, "cv::imread %s failed\n", imagepath);
        return -1;
    }

#if NCNN_VULKAN
    ncnn::create_gpu_instance();
#endif // NCNN_VULKAN

    std::vector<Object> objects;
    detect_yolov2(m, objects);

#if NCNN_VULKAN
    ncnn::destroy_gpu_instance();
#endif // NCNN_VULKAN

    draw_objects(m, objects);

    return 0;
}